

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O1

void adios2::utils::print_decomp<int>(Engine *fp,IO *io,Variable<int> *variable)

{
  uint uVar1;
  undefined8 uVar2;
  pointer pMVar3;
  _Base_ptr p_Var4;
  DataType DVar5;
  undefined8 uVar6;
  pointer puVar7;
  undefined8 *puVar8;
  _Rb_tree_node_base *p_Var9;
  Variable<int> *pVVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  Engine *pEVar14;
  size_t sVar15;
  ulong uVar16;
  char *pcVar17;
  _Base_ptr p_Var18;
  pointer puVar19;
  uint *puVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  map<unsigned_long,_std::vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>_>_>_>
  allblocks;
  allocator_type local_16d;
  DataType local_16c;
  pointer local_168;
  pointer puStack_160;
  pointer local_158;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *local_148;
  Engine *local_140;
  ulong local_138;
  Variable<int> *local_130;
  undefined1 local_128 [24];
  _Rb_tree_node_base *local_110;
  long local_100;
  uint local_f4;
  size_t local_f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  ulong local_a8;
  IO *local_a0;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_16c = *(DataType *)(variable + 0x28);
  local_a0 = io;
  puVar8 = (undefined8 *)
           (**(code **)(*(long *)fp + 0x58))(fp,variable,*(long *)(variable + 0xf8) + -1);
  local_140 = fp;
  local_130 = variable;
  if (puVar8 == (undefined8 *)0x0) {
    adios2::core::Engine::AllStepsBlocksInfo<int>((Variable *)local_128);
    if (local_100 != 0) {
      lVar22 = std::_Rb_tree_decrement((_Rb_tree_node_base *)(local_128 + 8));
      iVar13 = snprintf(ndigits(unsigned_long)::digitstr,0x20,"%zu",*(undefined8 *)(lVar22 + 0x20));
      local_138 = CONCAT44(local_138._4_4_,iVar13);
      if ((*(int *)(variable + 0x40) == 4) || (*(int *)(variable + 0x40) == 1)) {
        p_Var9 = local_110;
        if (local_110 != (_Rb_tree_node_base *)(local_128 + 8)) {
          do {
            fprintf(outf,"%c       step %*zu: ",(ulong)(uint)(int)commentchar,local_138 & 0xffffffff
                   );
            lVar22 = (long)p_Var9[1]._M_left - (long)p_Var9[1]._M_parent;
            if (lVar22 == 0x198) {
              fwrite(" = ",3,1,outf);
              print_data(&p_Var9[1]._M_parent[7]._M_left,0,local_16c,true,false);
              fputc(10,outf);
            }
            else {
              fprintf(outf,"%zu instances available\n",(lVar22 >> 3) * -0x505050505050505);
            }
            if (dump == '\x01') {
              fwrite("               ",0xf,1,outf);
              p_Var18 = p_Var9[1]._M_parent;
              if (p_Var9[1]._M_left != p_Var18) {
                uVar21 = 0;
                lVar22 = 0xf0;
                iVar13 = 0;
                do {
                  print_data((void *)((long)&p_Var18->_M_color + lVar22),0,local_16c,true,false);
                  iVar13 = iVar13 + 1;
                  if (uVar21 < ((long)p_Var9[1]._M_left - (long)p_Var9[1]._M_parent >> 3) *
                               -0x505050505050505 - 1U) {
                    if (iVar13 < ncols) {
                      fputc(0x20,outf);
                    }
                    else {
                      fwrite("\n               ",0x10,1,outf);
                      iVar13 = 0;
                    }
                  }
                  uVar21 = uVar21 + 1;
                  p_Var18 = p_Var9[1]._M_parent;
                  lVar22 = lVar22 + 0x198;
                } while (uVar21 < (ulong)(((long)p_Var9[1]._M_left - (long)p_Var18 >> 3) *
                                         -0x505050505050505));
              }
              fputc(10,outf);
            }
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          } while (p_Var9 != (_Rb_tree_node_base *)(local_128 + 8));
        }
      }
      else {
        if (*(long *)(variable + 0x90) - *(long *)(variable + 0x88) != 0) {
          lVar23 = *(long *)(variable + 0x90) - *(long *)(variable + 0x88) >> 3;
          lVar23 = lVar23 + (ulong)(lVar23 == 0);
          lVar22 = 0;
          do {
            pVVar10 = variable + 0x88;
            if (*(int *)(variable + 0x40) == 2) {
              pVVar10 = variable + 0x58;
            }
            iVar13 = snprintf(ndigits(unsigned_long)::digitstr,0x20,"%zu",
                              *(long *)(*(long *)pVVar10 + lVar22 * 2) + -1);
            *(int *)((long)&ndigits_dims + lVar22) = iVar13;
            lVar22 = lVar22 + 4;
            lVar23 = lVar23 + -1;
          } while (lVar23 != 0);
        }
        if (local_110 != (_Rb_tree_node_base *)(local_128 + 8)) {
          local_f0 = 0;
          p_Var9 = local_110;
          do {
            p_Var18 = p_Var9[1]._M_left;
            p_Var4 = p_Var9[1]._M_parent;
            lVar22 = ((long)p_Var18 - (long)p_Var4 >> 3) * -0x505050505050505;
            fprintf(outf,"%c       step %*zu: ",(ulong)(uint)(int)commentchar,local_138 & 0xffffffff
                    ,*(undefined8 *)(p_Var9 + 1));
            fputc(10,outf);
            iVar13 = snprintf(ndigits(unsigned_long)::digitstr,0x20,"%zu",lVar22 + -1);
            local_148 = (vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                        CONCAT44(local_148._4_4_,iVar13);
            if (p_Var18 != p_Var4) {
              local_a8 = lVar22 + (ulong)(lVar22 == 0);
              sVar15 = 0;
              do {
                fprintf(outf,"%c         block %*zu: [",(ulong)(uint)(int)commentchar,
                        (ulong)local_148 & 0xffffffff);
                if (*(long *)(variable + 0x90) - *(long *)(variable + 0x88) != 0) {
                  lVar22 = *(long *)(variable + 0x90) - *(long *)(variable + 0x88) >> 3;
                  puVar20 = &ndigits_dims;
                  uVar21 = 0;
                  do {
                    lVar23 = *(long *)(*(long *)((long)p_Var9[1]._M_parent + sVar15 * 0x198 + 0x60)
                                      + uVar21 * 8);
                    if (lVar23 == 0) {
                      uVar16 = (ulong)(*puVar20 * 2 + 1);
                      pcVar17 = "%-*s";
                      pcVar12 = "null";
LAB_00132479:
                      fprintf(outf,pcVar17,uVar16,pcVar12);
                    }
                    else {
                      uVar16 = (ulong)*puVar20;
                      if (*(int *)(local_130 + 0x40) != 2) {
                        pcVar12 = (char *)(lVar23 + -1);
                        pcVar17 = "0:%*zu";
                        goto LAB_00132479;
                      }
                      lVar11 = *(long *)(*(long *)((long)p_Var9[1]._M_parent + sVar15 * 0x198 + 0x48
                                                  ) + uVar21 * 8);
                      fprintf(outf,"%*zu:%*zu",uVar16,lVar11,(ulong)*puVar20,lVar23 + lVar11 + -1);
                    }
                    if (uVar21 < lVar22 - 1U) {
                      fwrite(", ",2,1,outf);
                    }
                    uVar21 = uVar21 + 1;
                    puVar20 = puVar20 + 1;
                  } while (lVar22 + (ulong)(lVar22 == 0) != uVar21);
                }
                fputc(0x5d,outf);
                if (longopt != '\0') {
                  fwrite(" = ",3,1,outf);
                  DVar5 = local_16c;
                  print_data((void *)((long)p_Var9[1]._M_parent + sVar15 * 0x198 + 0xe8),0,local_16c
                             ,false,false);
                  fwrite(" / ",3,1,outf);
                  print_data((void *)((long)p_Var9[1]._M_parent + sVar15 * 0x198 + 0xec),0,DVar5,
                             false,false);
                }
                fputc(10,outf);
                variable = local_130;
                if (dump == '\x01') {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            (&local_78,
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             ((long)p_Var9[1]._M_parent + sVar15 * 0x198 + 0x60));
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            (&local_48,
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             ((long)p_Var9[1]._M_parent + sVar15 * 0x198 + 0x48));
                  readVarBlock<int>(local_140,local_a0,variable,local_f0,sVar15,&local_78,&local_48)
                  ;
                  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_48.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_78.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                sVar15 = sVar15 + 1;
              } while (sVar15 != local_a8);
            }
            local_f0 = local_f0 + 1;
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          } while (p_Var9 != (_Rb_tree_node_base *)(local_128 + 8));
        }
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>_>_>_>
                 *)local_128);
  }
  else {
    uVar2 = *puVar8;
    if ((void *)puVar8[4] != (void *)0x0) {
      operator_delete((void *)puVar8[4]);
    }
    operator_delete(puVar8);
    local_f4 = snprintf(ndigits(unsigned_long)::digitstr,0x20,"%zu",uVar2);
    if ((*(int *)(variable + 0x40) == 1) || (*(int *)(variable + 0x40) == 4)) {
      if (*(long *)(variable + 0xf8) != 0) {
        uVar21 = 0;
        pEVar14 = local_140;
        do {
          puVar8 = (undefined8 *)(**(code **)(*(long *)pEVar14 + 0x58))(pEVar14,variable,uVar21);
          local_148 = (vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                      (puVar8 + 4);
          std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::vector
                    ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                     local_128,local_148);
          fprintf(outf,"%c       step %*zu: ",(ulong)(uint)(int)commentchar,(ulong)local_f4,*puVar8)
          ;
          if (local_128._8_8_ - local_128._0_8_ == 0x50) {
            fwrite(" = ",3,1,outf);
            print_data(*(void **)(local_128._0_8_ + 0x40),0,local_16c,true,true);
            fputc(10,outf);
          }
          else {
            fprintf(outf,"%zu instances available\n",
                    ((long)(local_128._8_8_ - local_128._0_8_) >> 4) * -0x3333333333333333);
          }
          if (dump == '\x01') {
            fwrite("               ",0xf,1,outf);
            if (local_128._8_8_ != local_128._0_8_) {
              iVar13 = 0;
              lVar22 = 0x40;
              uVar16 = 0;
              do {
                print_data(*(void **)(local_128._0_8_ + lVar22),0,local_16c,true,true);
                iVar13 = iVar13 + 1;
                if (uVar16 < ((long)(local_128._8_8_ - local_128._0_8_) >> 4) * -0x3333333333333333
                             - 1U) {
                  if (iVar13 < ncols) {
                    fputc(0x20,outf);
                  }
                  else {
                    fwrite("\n               ",0x10,1,outf);
                    iVar13 = 0;
                  }
                }
                uVar16 = uVar16 + 1;
                lVar22 = lVar22 + 0x50;
              } while (uVar16 < (ulong)(((long)(local_128._8_8_ - local_128._0_8_) >> 4) *
                                       -0x3333333333333333));
            }
            fputc(10,outf);
            pEVar14 = local_140;
          }
          pMVar3 = (local_148->
                   super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (pMVar3 != (pointer)0x0) {
            operator_delete(pMVar3);
          }
          operator_delete(puVar8);
          if ((pointer)local_128._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_128._0_8_);
          }
          uVar21 = uVar21 + 1;
          variable = local_130;
        } while (uVar21 < *(ulong *)(local_130 + 0xf8));
      }
    }
    else if (*(long *)(variable + 0xf8) != 0) {
      local_138 = 0;
      pEVar14 = local_140;
      do {
        puVar8 = (undefined8 *)(**(code **)(*(long *)pEVar14 + 0x58))(pEVar14,variable,local_138);
        local_98 = (vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                   (puVar8 + 4);
        std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::vector
                  ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)local_128,
                   local_98);
        if (*(long *)(variable + 0x90) - *(long *)(variable + 0x88) != 0) {
          lVar22 = *(long *)(variable + 0x90) - *(long *)(variable + 0x88) >> 3;
          lVar22 = lVar22 + (ulong)(lVar22 == 0);
          lVar23 = 0;
          do {
            pVVar10 = variable + 0x88;
            if (*(int *)(variable + 0x40) == 2) {
              pVVar10 = variable + 0x58;
            }
            iVar13 = snprintf(ndigits(unsigned_long)::digitstr,0x20,"%zu",
                              *(long *)(*(long *)pVVar10 + lVar23 * 2) + -1);
            *(int *)((long)&ndigits_dims + lVar23) = iVar13;
            lVar23 = lVar23 + 4;
            lVar22 = lVar22 + -1;
          } while (lVar22 != 0);
        }
        fprintf(outf,"%c       step %*zu: ",(ulong)(uint)(int)commentchar,(ulong)local_f4,*puVar8);
        fputc(10,outf);
        uVar6 = local_128._8_8_;
        uVar2 = local_128._0_8_;
        lVar22 = ((long)(local_128._8_8_ - local_128._0_8_) >> 4) * -0x3333333333333333;
        iVar13 = snprintf(ndigits(unsigned_long)::digitstr,0x20,"%zu",lVar22 + -1);
        local_a8 = CONCAT44(local_a8._4_4_,iVar13);
        if (uVar6 != uVar2) {
          local_f0 = lVar22 + (ulong)(lVar22 == 0);
          sVar15 = 0;
          do {
            fprintf(outf,"%c         block %*zu: [",(ulong)(uint)(int)commentchar,
                    local_a8 & 0xffffffff);
            local_148 = (vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                        (*(long *)(variable + 0x90) - *(long *)(variable + 0x88));
            if (local_148 !=
                (vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)0x0) {
              lVar22 = (long)local_148 >> 3;
              puVar20 = &ndigits_dims;
              uVar21 = 0;
              do {
                lVar23 = *(long *)(local_128._0_8_ + sVar15 * 0x50 + 0x18);
                if (*(char *)(puVar8 + 1) != '\x01') {
                  lVar23 = *(long *)(lVar23 + uVar21 * 8);
                }
                if (lVar23 == 0) {
                  uVar1 = *puVar20 * 2 + 1;
                  pcVar17 = "%-*s";
                  pcVar12 = "null";
LAB_00131e22:
                  fprintf(outf,pcVar17,(ulong)uVar1,pcVar12);
                }
                else {
                  if (*(int *)(local_130 + 0x40) != 2) {
                    uVar1 = *puVar20;
                    pcVar12 = (char *)(lVar23 + -1);
                    pcVar17 = "0:%*zu";
                    goto LAB_00131e22;
                  }
                  lVar11 = *(long *)(local_128._0_8_ + sVar15 * 0x50 + 0x10);
                  if (*(char *)(puVar8 + 1) == '\0') {
                    lVar11 = *(long *)(lVar11 + uVar21 * 8);
                  }
                  fprintf(outf,"%*zu:%*zu",(ulong)*puVar20,lVar11,(ulong)*puVar20,
                          lVar23 + lVar11 + -1);
                }
                if (uVar21 < lVar22 - 1U) {
                  fwrite(", ",2,1,outf);
                }
                uVar21 = uVar21 + 1;
                puVar20 = puVar20 + 1;
              } while (lVar22 + (ulong)(lVar22 == 0) != uVar21);
            }
            fputc(0x5d,outf);
            if (longopt != '\0') {
              fwrite(" = ",3,1,outf);
              DVar5 = local_16c;
              print_data((pointer)(local_128._0_8_ + sVar15 * 0x50 + 0x20),0,local_16c,false,false);
              fwrite(" / ",3,1,outf);
              print_data((pointer)(local_128._0_8_ + sVar15 * 0x50 + 0x30),0,DVar5,false,false);
            }
            fputc(10,outf);
            variable = local_130;
            if (dump == '\x01') {
              local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              if (*(int *)(local_130 + 0x40) == 2) {
                if (*(char *)(puVar8 + 1) != '\x01') {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  vector<unsigned_long*,void>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_168,
                             *(unsigned_long **)(local_128._0_8_ + sVar15 * 0x50 + 0x18),
                             (unsigned_long *)
                             ((long)*(unsigned_long **)(local_128._0_8_ + sVar15 * 0x50 + 0x18) +
                             (long)local_148),&local_16d);
                  puVar19 = local_e8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start = local_168;
                  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish = puStack_160;
                  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage = local_158;
                  local_168 = (pointer)0x0;
                  puStack_160 = (pointer)0x0;
                  local_158 = (pointer)0x0;
                  if (puVar19 != (pointer)0x0) {
                    operator_delete(puVar19);
                  }
                  if (local_168 != (pointer)0x0) {
                    operator_delete(local_168);
                  }
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  vector<unsigned_long*,void>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_168,
                             *(unsigned_long **)(local_128._0_8_ + sVar15 * 0x50 + 0x10),
                             (unsigned_long *)
                             ((long)&(local_148->
                                     super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>
                                     )._M_impl.super__Vector_impl_data._M_start +
                             (long)*(unsigned_long **)(local_128._0_8_ + sVar15 * 0x50 + 0x10)),
                             &local_16d);
                  puVar7 = local_c8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start = local_168;
                  local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish = puStack_160;
                  local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage = local_158;
                  local_168 = (pointer)0x0;
                  puStack_160 = (pointer)0x0;
                  local_158 = (pointer)0x0;
                  puVar19 = local_168;
                  if (puVar7 != (pointer)0x0) {
                    operator_delete(puVar7);
                    puVar19 = local_168;
                  }
                  goto LAB_00132176;
                }
                local_168 = *(pointer *)(local_128._0_8_ + sVar15 * 0x50 + 0x18);
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_assign_aux<unsigned_long_const*>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_e8,
                           (vector<unsigned_long,std::allocator<unsigned_long>> *)&local_168,
                           &puStack_160);
                local_168 = *(pointer *)(local_128._0_8_ + sVar15 * 0x50 + 0x10);
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_assign_aux<unsigned_long_const*>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_c8,
                           (vector<unsigned_long,std::allocator<unsigned_long>> *)&local_168,
                           &puStack_160);
              }
              else {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                vector<unsigned_long*,void>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_168,
                           *(unsigned_long **)(local_128._0_8_ + sVar15 * 0x50 + 0x18),
                           (unsigned_long *)
                           ((long)&(local_148->
                                   super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>
                                   )._M_impl.super__Vector_impl_data._M_start +
                           (long)*(unsigned_long **)(local_128._0_8_ + sVar15 * 0x50 + 0x18)),
                           &local_16d);
                puVar19 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start = local_168;
                local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish = puStack_160;
                local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = local_158;
                local_168 = (pointer)0x0;
                puStack_160 = (pointer)0x0;
                local_158 = (pointer)0x0;
                if (puVar19 != (pointer)0x0) {
                  operator_delete(puVar19);
                }
                if (local_168 != (pointer)0x0) {
                  operator_delete(local_168);
                }
                puVar19 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00132176:
                if (puVar19 != (pointer)0x0) {
                  operator_delete(puVar19);
                }
              }
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_60,&local_e8);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_90,&local_c8);
              readVarBlock<int>(local_140,local_a0,variable,local_138,sVar15,&local_60,&local_90);
              if (local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_90.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_60.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_e8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_c8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
            }
            sVar15 = sVar15 + 1;
          } while (sVar15 != local_f0);
        }
        pMVar3 = (local_98->
                 super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if (pMVar3 != (pointer)0x0) {
          operator_delete(pMVar3);
        }
        operator_delete(puVar8);
        uVar21 = local_138;
        pEVar14 = local_140;
        if ((pointer)local_128._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_128._0_8_);
        }
        local_138 = uVar21 + 1;
      } while (local_138 < *(ulong *)(variable + 0xf8));
    }
  }
  return;
}

Assistant:

void print_decomp(core::Engine *fp, core::IO *io, core::Variable<T> *variable)
{
    /* Print block info */
    DataType adiosvartype = variable->m_Type;

    MinVarInfo *mBI = nullptr;
    mBI = fp->MinBlocksInfo(*variable, variable->m_AvailableStepsCount - 1 /* relative step 0 */);

    // first step
    if (mBI)
    {
        size_t laststep = mBI->Step; // used relative last step above
        delete mBI;
        int ndigits_nsteps = ndigits(laststep);
        if (variable->m_ShapeID == ShapeID::GlobalValue ||
            variable->m_ShapeID == ShapeID::LocalValue)
        {
            for (size_t RelStep = 0; RelStep < variable->m_AvailableStepsCount; RelStep++)
            {
                auto minBlocksInfo = fp->MinBlocksInfo(*variable, RelStep);
                auto blocks = minBlocksInfo->BlocksInfo;
                fprintf(outf, "%c       step %*zu: ", commentchar, ndigits_nsteps,
                        minBlocksInfo->Step);
                if (blocks.size() == 1)
                {
                    fprintf(outf, " = ");
                    print_data(blocks[0].BufferP, 0, adiosvartype, true, /* MBI */ true);
                    fprintf(outf, "\n");
                }
                else
                {
                    fprintf(outf, "%zu instances available\n", blocks.size());
                }
                if (dump)
                {
                    fprintf(outf, "               ");
                    int col = 0;
                    for (size_t j = 0; j < blocks.size(); j++)
                    {
                        print_data(blocks[j].BufferP, 0, adiosvartype, true, /* MBI */ true);
                        ++col;
                        if (j < blocks.size() - 1)
                        {
                            if (col < ncols)
                            {
                                fprintf(outf, " ");
                            }
                            else
                            {
                                fprintf(outf, "\n               ");
                                col = 0;
                            }
                        }
                    }
                    fprintf(outf, "\n");
                }
                delete minBlocksInfo;
            }
        }
        else
        {
            // arrays
            for (size_t RelStep = 0; RelStep < variable->m_AvailableStepsCount; RelStep++)
            {
                auto minBlocksInfo = fp->MinBlocksInfo(*variable, RelStep);
                auto blocks = minBlocksInfo->BlocksInfo;
                size_t ndim = variable->m_Count.size();
                int ndigits_nblocks;
                for (size_t k = 0; k < ndim; k++)
                {
                    // get digit lengths for each dimension
                    if (variable->m_ShapeID == ShapeID::GlobalArray)
                    {
                        ndigits_dims[k] = ndigits(variable->m_Shape[k] - 1);
                    }
                    else
                    {
                        ndigits_dims[k] = ndigits(variable->m_Count[k] - 1);
                    }
                }

                size_t stepAbsolute = minBlocksInfo->Step;

                fprintf(outf, "%c       step %*zu: ", commentchar, ndigits_nsteps, stepAbsolute);
                fprintf(outf, "\n");
                const size_t blocksSize = blocks.size();
                ndigits_nblocks = ndigits(blocksSize - 1);

                for (size_t j = 0; j < blocksSize; j++)
                {
                    fprintf(outf, "%c         block %*zu: [", commentchar, ndigits_nblocks, j);

                    // just in case ndim for a block changes in LocalArrays:
                    ndim = variable->m_Count.size();

                    for (size_t k = 0; k < ndim; k++)
                    {
                        size_t c = (minBlocksInfo->WasLocalValue
                                        ? reinterpret_cast<size_t>(blocks[j].Count)
                                        : blocks[j].Count[k]);

                        if (c)
                        {
                            if (variable->m_ShapeID == ShapeID::GlobalArray)
                            {
                                size_t s = (minBlocksInfo->WasLocalValue
                                                ? reinterpret_cast<size_t>(blocks[j].Start)
                                                : blocks[j].Start[k]);
                                fprintf(outf, "%*zu:%*zu", ndigits_dims[k], s, ndigits_dims[k],
                                        s + c - 1);
                            }
                            else
                            {
                                // blockStart is empty vector for LocalArrays
                                fprintf(outf, "0:%*zu", ndigits_dims[k], c - 1);
                            }
                        }
                        else
                        {
                            fprintf(outf, "%-*s", 2 * ndigits_dims[k] + 1, "null");
                        }
                        if (k < ndim - 1)
                            fprintf(outf, ", ");
                    }
                    fprintf(outf, "]");

                    /* Print per-block statistics if available */
                    if (longopt)
                    {
                        if (true /* TODO: variable->has_minmax */)
                        {
                            fprintf(outf, " = ");
                            print_data(&blocks[j].MinMax.MinUnion, 0, adiosvartype, false);

                            fprintf(outf, " / ");
                            print_data(&blocks[j].MinMax.MaxUnion, 0, adiosvartype, false);
                        }
                        else
                        {
                            fprintf(outf, "N/A / N/A");
                        }
                    }
                    fprintf(outf, "\n");
                    if (dump)
                    {
                        Dims s, c;
                        if (variable->m_ShapeID == ShapeID::GlobalArray)
                        {
                            if (minBlocksInfo->WasLocalValue)
                            {
                                c = {reinterpret_cast<size_t>(blocks[j].Count)};
                                s = {reinterpret_cast<size_t>(blocks[j].Start)};
                            }
                            else
                            {
                                c = Dims(blocks[j].Count, blocks[j].Count + ndim);
                                s = Dims(blocks[j].Start, blocks[j].Start + ndim);
                            }
                        }
                        else
                        {
                            c = Dims(blocks[j].Count, blocks[j].Count + ndim);
                            s = Dims(0, ndim);
                        }
                        readVarBlock(fp, io, variable, RelStep, j, c, s);
                    }
                }
                delete minBlocksInfo;
            }
        }
        return;
    }

    std::map<size_t, std::vector<typename core::Variable<T>::BPInfo>> allblocks =
        fp->AllStepsBlocksInfo(*variable);
    if (allblocks.empty())
    {
        return;
    }
    size_t laststep = allblocks.rbegin()->first;
    int ndigits_nsteps = ndigits(laststep);
    if (variable->m_ShapeID == ShapeID::GlobalValue || variable->m_ShapeID == ShapeID::LocalValue)
    {
        // scalars
        for (auto &blockpair : allblocks)
        {
            size_t step = blockpair.first;
            std::vector<typename adios2::core::Variable<T>::BPInfo> &blocks = blockpair.second;
            fprintf(outf, "%c       step %*zu: ", commentchar, ndigits_nsteps, step);
            if (blocks.size() == 1)
            {
                fprintf(outf, " = ");
                print_data(&blocks[0].Value, 0, adiosvartype, true);
                fprintf(outf, "\n");
            }
            else
            {
                fprintf(outf, "%zu instances available\n", blocks.size());
            }
            if (dump)
            {
                fprintf(outf, "               ");
                int col = 0;
                for (size_t j = 0; j < blocks.size(); j++)
                {
                    print_data(&blocks[j].Value, 0, adiosvartype, true);
                    ++col;
                    if (j < blocks.size() - 1)
                    {
                        if (col < ncols)
                        {
                            fprintf(outf, " ");
                        }
                        else
                        {
                            fprintf(outf, "\n               ");
                            col = 0;
                        }
                    }
                }
                fprintf(outf, "\n");
            }
        }
        return;
    }
    else
    {
        // arrays
        size_t ndim = variable->m_Count.size();
        int ndigits_nblocks;
        for (size_t k = 0; k < ndim; k++)
        {
            // get digit lengths for each dimension
            if (variable->m_ShapeID == ShapeID::GlobalArray)
            {
                ndigits_dims[k] = ndigits(variable->m_Shape[k] - 1);
            }
            else
            {
                ndigits_dims[k] = ndigits(variable->m_Count[k] - 1);
            }
        }

        size_t stepRelative = 0;
        for (auto &blockpair : allblocks)
        {
            size_t stepAbsolute = blockpair.first;
            std::vector<typename adios2::core::Variable<T>::BPInfo> &blocks = blockpair.second;
            const size_t blocksSize = blocks.size();
            fprintf(outf, "%c       step %*zu: ", commentchar, ndigits_nsteps, stepAbsolute);
            fprintf(outf, "\n");
            ndigits_nblocks = ndigits(blocksSize - 1);

            for (size_t j = 0; j < blocksSize; j++)
            {
                fprintf(outf, "%c         block %*zu: [", commentchar, ndigits_nblocks, j);

                // just in case ndim for a block changes in LocalArrays:
                ndim = variable->m_Count.size();

                for (size_t k = 0; k < ndim; k++)
                {
                    if (blocks[j].Count[k])
                    {
                        if (variable->m_ShapeID == ShapeID::GlobalArray)
                        {
                            fprintf(outf, "%*zu:%*zu", ndigits_dims[k], blocks[j].Start[k],
                                    ndigits_dims[k], blocks[j].Start[k] + blocks[j].Count[k] - 1);
                        }
                        else
                        {
                            // blockStart is empty vector for LocalArrays
                            fprintf(outf, "0:%*zu", ndigits_dims[k], blocks[j].Count[k] - 1);
                        }
                    }
                    else
                    {
                        fprintf(outf, "%-*s", 2 * ndigits_dims[k] + 1, "null");
                    }
                    if (k < ndim - 1)
                        fprintf(outf, ", ");
                }
                fprintf(outf, "]");

                /* Print per-block statistics if available */
                if (longopt)
                {
                    if (true /* TODO: variable->has_minmax */)
                    {
                        fprintf(outf, " = ");
                        print_data(&blocks[j].Min, 0, adiosvartype, false);

                        fprintf(outf, " / ");
                        print_data(&blocks[j].Max, 0, adiosvartype, false);
                    }
                    else
                    {
                        fprintf(outf, "N/A / N/A");
                    }
                }
                fprintf(outf, "\n");
                if (dump)
                {
                    readVarBlock(fp, io, variable, stepRelative, j, blocks[j].Count,
                                 blocks[j].Start);
                }
            }
            ++stepRelative;
        }
    }
}